

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

char * __thiscall
google::protobuf::io::Printer::WriteVariable
          (Printer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *vars,char *format,int *arg_index,
          vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *annotations)

{
  ulong uVar1;
  long lVar2;
  AnnotationCollector *pAVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  long lVar6;
  const_iterator cVar7;
  char *data;
  pointer ppVar8;
  _Alloc_hider _Var9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  Printer *pPVar13;
  size_type *local_d0;
  string sub;
  undefined1 local_a8 [8];
  string var_name;
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  size_type local_60 [3];
  Printer *local_48;
  int *local_40;
  LogFinisher local_31;
  
  var_name.field_2._8_8_ = args;
  local_48 = this;
  local_40 = arg_index;
  pcVar4 = strchr(format,0x24);
  if (pcVar4 == (char *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
               ,0x13a);
    pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_80," Unclosed variable name.");
    internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
    internal::LogMessage::~LogMessage((LogMessage *)local_80);
  }
  pPVar13 = local_48;
  if (pcVar4 == format) {
    if (local_48->at_start_of_line_ == true) {
      CopyToBuffer(local_48,(local_48->indent_)._M_dataplus._M_p,
                   (int)(local_48->indent_)._M_string_length);
      pPVar13->at_start_of_line_ = false;
    }
    push_back(pPVar13,'$');
  }
  else {
    if (*format == '{') {
      if ((int)format[1] - 0x3aU < 0xfffffff6) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                   ,0x144);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_80,"CHECK failed: std::isdigit(start[1]): ");
        internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_80);
      }
      if ((long)pcVar4 - (long)format != 2) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                   ,0x145);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_80,"CHECK failed: (end - start) == (2): ");
        internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_80);
      }
      iVar12 = (int)format[1];
      uVar1 = (long)iVar12 - 0x31;
      if ((iVar12 < 0x31) ||
         ((ulong)(*(long *)(var_name.field_2._8_8_ + 8) - *(long *)var_name.field_2._8_8_ >> 5) <=
          (uVar1 & 0xffffffff))) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                   ,0x148);
        pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_80,"Annotation ${");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,iVar12 + -0x30);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,"$ is out of bounds.");
        internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_80);
      }
      if (*local_40 < (int)uVar1) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                   ,0x14b);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_80,
                            "Annotation arg must be in correct order as given. Expected");
        pLVar5 = internal::LogMessage::operator<<(pLVar5," ${");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,*local_40 + 1);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,"$ got ${");
        pLVar5 = internal::LogMessage::operator<<(pLVar5,iVar12 + -0x30);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,"$.");
        internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
        pPVar13 = local_48;
        internal::LogMessage::~LogMessage((LogMessage *)local_80);
      }
      else {
        pPVar13 = local_48;
        if ((int)uVar1 == *local_40) {
          *local_40 = iVar12 + -0x30;
        }
      }
      if (pPVar13->at_start_of_line_ == true) {
        CopyToBuffer(pPVar13,(pPVar13->indent_)._M_dataplus._M_p,
                     (int)(pPVar13->indent_)._M_string_length);
        pPVar13->at_start_of_line_ = false;
      }
      local_80._0_8_ = pPVar13->offset_;
      local_80._8_8_ = (char *)0x0;
      lVar2 = *(long *)(*(long *)var_name.field_2._8_8_ + uVar1 * 0x20);
      local_70._M_p = (pointer)local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,lVar2,
                 *(long *)(*(long *)var_name.field_2._8_8_ + 8 + uVar1 * 0x20) + lVar2);
      std::
      vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>
                ((vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                  *)annotations,
                 (pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80);
      _Var9._M_p = local_70._M_p;
      if ((size_type *)local_70._M_p == local_60) goto LAB_002d6f72;
    }
    else if (*format == '}') {
      if (annotations ==
          (vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                   ,0x154);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_80,"CHECK failed: annotations: ");
        pPVar13 = local_48;
        internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_80);
      }
      ppVar8 = (annotations->
               super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((annotations->
          super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == ppVar8) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                   ,0x156);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_80,"Unexpected end of annotation found.");
        internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_80);
        ppVar8 = (annotations->
                 super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      ppVar8[-1].first.second = pPVar13->offset_;
      pAVar3 = pPVar13->annotation_collector_;
      if (pAVar3 != (AnnotationCollector *)0x0) {
        (**(code **)(*(long *)pAVar3 + 8))(pAVar3,ppVar8 + -1);
        ppVar8 = (annotations->
                 super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      (annotations->
      super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppVar8 + -1;
      _Var9._M_p = ppVar8[-1].second._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p == &ppVar8[-1].second.field_2) goto LAB_002d6f72;
    }
    else {
      pcVar11 = format;
      pcVar10 = format;
      if (format < pcVar4) {
        do {
          pcVar11 = pcVar10;
          if (*pcVar10 != ' ') break;
          pcVar10 = pcVar10 + 1;
          pcVar11 = pcVar4;
        } while (pcVar10 != pcVar4);
      }
      if (pcVar11 == pcVar4) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                   ,0x161);
        pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_80," Empty variable.");
        internal::LogFinisher::operator=((LogFinisher *)local_a8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_80);
      }
      lVar2 = 0;
      pcVar10 = pcVar4;
      do {
        data = pcVar10;
        lVar6 = lVar2;
        if (data <= pcVar11) break;
        lVar2 = lVar6 + 1;
        pcVar10 = data + -1;
      } while (data[-1] == ' ');
      local_a8 = (undefined1  [8])&var_name._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,pcVar11,(long)pcVar4 - lVar6);
      local_d0 = &sub._M_string_length;
      sub._M_dataplus._M_p = (pointer)0x0;
      sub._M_string_length._0_1_ = 0;
      if ((int)*(char *)local_a8 - 0x30U < 10) {
        if (var_name._M_dataplus._M_p != (pointer)0x1) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                     ,0x169);
          pLVar5 = internal::LogMessage::operator<<
                             ((LogMessage *)local_80,"CHECK failed: (var_name.size()) == (1): ");
          internal::LogFinisher::operator=(&local_31,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_80);
        }
        iVar12 = (int)*(char *)local_a8;
        if (iVar12 < 0x31) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                     ,0x16b);
          pLVar5 = internal::LogMessage::operator<<
                             ((LogMessage *)local_80,"CHECK failed: (idx) >= (0): ");
          internal::LogFinisher::operator=(&local_31,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_80);
        }
        sub.field_2._8_8_ = (long)iVar12 - 0x31;
        if ((ulong)(*(long *)(var_name.field_2._8_8_ + 8) - *(long *)var_name.field_2._8_8_ >> 5) <=
            (ulong)sub.field_2._8_8_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                     ,0x16d);
          pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_80,"Argument $");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,iVar12 + -0x30);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"$ is out of bounds.");
          internal::LogFinisher::operator=(&local_31,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_80);
        }
        if (*local_40 < (int)sub.field_2._8_8_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                     ,0x170);
          pLVar5 = internal::LogMessage::operator<<
                             ((LogMessage *)local_80,
                              "Arguments must be used in same order as given. Expected $");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,*local_40 + 1);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"$ got $");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,iVar12 + -0x30);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,"$.");
          internal::LogFinisher::operator=(&local_31,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_80);
        }
        else if ((int)sub.field_2._8_8_ == *local_40) {
          *local_40 = iVar12 + -0x30;
        }
        std::__cxx11::string::_M_assign((string *)&local_d0);
      }
      else {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&vars->_M_t,(key_type *)local_a8);
        if ((_Rb_tree_header *)cVar7._M_node == &(vars->_M_t)._M_impl.super__Rb_tree_header) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/printer.cc"
                     ,0x179);
          pLVar5 = internal::LogMessage::operator<<((LogMessage *)local_80," Unknown variable: ");
          pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)local_a8);
          pLVar5 = internal::LogMessage::operator<<(pLVar5,".");
          internal::LogFinisher::operator=(&local_31,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_80);
        }
        std::__cxx11::string::_M_assign((string *)&local_d0);
      }
      pPVar13 = local_48;
      if (sub._M_dataplus._M_p != (pointer)0x0) {
        if (local_48->at_start_of_line_ == true) {
          CopyToBuffer(local_48,(local_48->indent_)._M_dataplus._M_p,
                       (int)(local_48->indent_)._M_string_length);
          pPVar13->at_start_of_line_ = false;
        }
        CopyToBuffer(pPVar13,format,(int)pcVar11 - (int)format);
        CopyToBuffer(pPVar13,(char *)local_d0,(int)sub._M_dataplus._M_p);
        CopyToBuffer(pPVar13,data,(int)lVar6);
      }
      if (local_d0 != &sub._M_string_length) {
        operator_delete(local_d0);
      }
      _Var9._M_p = (pointer)local_a8;
      if (local_a8 == (undefined1  [8])&var_name._M_string_length) goto LAB_002d6f72;
    }
    operator_delete(_Var9._M_p);
  }
LAB_002d6f72:
  return pcVar4 + 1;
}

Assistant:

const char* Printer::WriteVariable(
    const std::vector<string>& args,
    const std::map<std::string, std::string>& vars, const char* format,
    int* arg_index, std::vector<AnnotationCollector::Annotation>* annotations) {
  auto start = format;
  auto end = strchr(format, '$');
  if (!end) {
    GOOGLE_LOG(FATAL) << " Unclosed variable name.";
  }
  format = end + 1;
  if (end == start) {
    // "$$" is an escape for just '$'
    IndentIfAtStart();
    push_back('$');
    return format;
  }
  if (*start == '{') {
    GOOGLE_CHECK(std::isdigit(start[1]));
    GOOGLE_CHECK_EQ(end - start, 2);
    int idx = start[1] - '1';
    if (idx < 0 || idx >= args.size()) {
      GOOGLE_LOG(FATAL) << "Annotation ${" << idx + 1 << "$ is out of bounds.";
    }
    if (idx > *arg_index) {
      GOOGLE_LOG(FATAL) << "Annotation arg must be in correct order as given. Expected"
                 << " ${" << (*arg_index) + 1 << "$ got ${" << idx + 1 << "$.";
    } else if (idx == *arg_index) {
      (*arg_index)++;
    }
    IndentIfAtStart();
    annotations->push_back({{offset_, 0}, args[idx]});
    return format;
  } else if (*start == '}') {
    GOOGLE_CHECK(annotations);
    if (annotations->empty()) {
      GOOGLE_LOG(FATAL) << "Unexpected end of annotation found.";
    }
    auto& a = annotations->back();
    a.first.second = offset_;
    if (annotation_collector_) annotation_collector_->AddAnnotationNew(a);
    annotations->pop_back();
    return format;
  }
  auto start_var = start;
  while (start_var < end && *start_var == ' ') start_var++;
  if (start_var == end) {
    GOOGLE_LOG(FATAL) << " Empty variable.";
  }
  auto end_var = end;
  while (start_var < end_var && *(end_var - 1) == ' ') end_var--;
  std::string var_name{
      start_var, static_cast<std::string::size_type>(end_var - start_var)};
  std::string sub;
  if (std::isdigit(var_name[0])) {
    GOOGLE_CHECK_EQ(var_name.size(), 1);  // No need for multi-digits
    int idx = var_name[0] - '1';   // Start counting at 1
    GOOGLE_CHECK_GE(idx, 0);
    if (idx >= args.size()) {
      GOOGLE_LOG(FATAL) << "Argument $" << idx + 1 << "$ is out of bounds.";
    }
    if (idx > *arg_index) {
      GOOGLE_LOG(FATAL) << "Arguments must be used in same order as given. Expected $"
                 << (*arg_index) + 1 << "$ got $" << idx + 1 << "$.";
    } else if (idx == *arg_index) {
      (*arg_index)++;
    }
    sub = args[idx];
  } else {
    auto it = vars.find(var_name);
    if (it == vars.end()) {
      GOOGLE_LOG(FATAL) << " Unknown variable: " << var_name << ".";
    }
    sub = it->second;
  }

  // By returning here in case of empty we also skip possible spaces inside
  // the $...$, i.e. "void$ dllexpor$ f();" -> "void f();" in the empty case.
  if (sub.empty()) return format;

  // We're going to write something non-empty so we need a possible indent.
  IndentIfAtStart();

  // Write the possible spaces in front.
  CopyToBuffer(start, start_var - start);
  // Write a non-empty substituted variable.
  CopyToBuffer(sub.c_str(), sub.size());
  // Finish off with writing possible trailing spaces.
  CopyToBuffer(end_var, end - end_var);
  return format;
}